

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O1

void opengv::absolute_pose::modules::gpnp4::compute
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix)

{
  sPolynomial5(groebnerMatrix);
  sPolynomial6(groebnerMatrix);
  groebnerRow5_0000_f(groebnerMatrix,6);
  sPolynomial7(groebnerMatrix);
  groebnerRow5_0000_f(groebnerMatrix,7);
  groebnerRow6_0000_f(groebnerMatrix,7);
  sPolynomial8(groebnerMatrix);
  groebnerRow5_0000_f(groebnerMatrix,8);
  groebnerRow6_0000_f(groebnerMatrix,8);
  groebnerRow7_0000_f(groebnerMatrix,8);
  sPolynomial9(groebnerMatrix);
  groebnerRow7_0100_f(groebnerMatrix,9);
  groebnerRow8_0100_f(groebnerMatrix,9);
  groebnerRow5_1000_f(groebnerMatrix,9);
  groebnerRow6_1000_f(groebnerMatrix,9);
  groebnerRow7_1000_f(groebnerMatrix,9);
  groebnerRow8_1000_f(groebnerMatrix,9);
  groebnerRow5_0000_f(groebnerMatrix,9);
  groebnerRow6_0000_f(groebnerMatrix,9);
  groebnerRow7_0000_f(groebnerMatrix,9);
  groebnerRow8_0000_f(groebnerMatrix,9);
  sPolynomial10(groebnerMatrix);
  groebnerRow6_0100_f(groebnerMatrix,10);
  groebnerRow7_0100_f(groebnerMatrix,10);
  groebnerRow8_0100_f(groebnerMatrix,10);
  groebnerRow9_0000_f(groebnerMatrix,10);
  groebnerRow5_1000_f(groebnerMatrix,10);
  groebnerRow6_1000_f(groebnerMatrix,10);
  groebnerRow7_1000_f(groebnerMatrix,10);
  groebnerRow8_1000_f(groebnerMatrix,10);
  groebnerRow5_0000_f(groebnerMatrix,10);
  groebnerRow6_0000_f(groebnerMatrix,10);
  groebnerRow7_0000_f(groebnerMatrix,10);
  groebnerRow8_0000_f(groebnerMatrix,10);
  sPolynomial11(groebnerMatrix);
  groebnerRow6_0100_f(groebnerMatrix,0xb);
  groebnerRow7_0100_f(groebnerMatrix,0xb);
  groebnerRow8_0100_f(groebnerMatrix,0xb);
  groebnerRow9_0000_f(groebnerMatrix,0xb);
  groebnerRow4_1000_f(groebnerMatrix,0xb);
  groebnerRow5_1000_f(groebnerMatrix,0xb);
  groebnerRow6_1000_f(groebnerMatrix,0xb);
  groebnerRow7_1000_f(groebnerMatrix,0xb);
  groebnerRow8_1000_f(groebnerMatrix,0xb);
  groebnerRow10_0000_f(groebnerMatrix,0xb);
  groebnerRow4_0000_f(groebnerMatrix,0xb);
  groebnerRow5_0000_f(groebnerMatrix,0xb);
  groebnerRow6_0000_f(groebnerMatrix,0xb);
  groebnerRow7_0000_f(groebnerMatrix,0xb);
  groebnerRow8_0000_f(groebnerMatrix,0xb);
  sPolynomial12(groebnerMatrix);
  groebnerRow5_0100_f(groebnerMatrix,0xc);
  groebnerRow6_0100_f(groebnerMatrix,0xc);
  groebnerRow7_0100_f(groebnerMatrix,0xc);
  groebnerRow8_0100_f(groebnerMatrix,0xc);
  groebnerRow9_0000_f(groebnerMatrix,0xc);
  groebnerRow4_1000_f(groebnerMatrix,0xc);
  groebnerRow5_1000_f(groebnerMatrix,0xc);
  groebnerRow6_1000_f(groebnerMatrix,0xc);
  groebnerRow7_1000_f(groebnerMatrix,0xc);
  groebnerRow8_1000_f(groebnerMatrix,0xc);
  groebnerRow10_0000_f(groebnerMatrix,0xc);
  groebnerRow11_0000_f(groebnerMatrix,0xc);
  groebnerRow4_0000_f(groebnerMatrix,0xc);
  groebnerRow5_0000_f(groebnerMatrix,0xc);
  groebnerRow6_0000_f(groebnerMatrix,0xc);
  groebnerRow7_0000_f(groebnerMatrix,0xc);
  groebnerRow8_0000_f(groebnerMatrix,0xc);
  sPolynomial13(groebnerMatrix);
  groebnerRow6_0010_f(groebnerMatrix,0xd);
  groebnerRow4_0100_f(groebnerMatrix,0xd);
  groebnerRow5_0100_f(groebnerMatrix,0xd);
  groebnerRow6_0100_f(groebnerMatrix,0xd);
  groebnerRow7_0100_f(groebnerMatrix,0xd);
  groebnerRow8_0100_f(groebnerMatrix,0xd);
  groebnerRow9_0000_f(groebnerMatrix,0xd);
  groebnerRow4_1000_f(groebnerMatrix,0xd);
  groebnerRow5_1000_f(groebnerMatrix,0xd);
  groebnerRow6_1000_f(groebnerMatrix,0xd);
  groebnerRow7_1000_f(groebnerMatrix,0xd);
  groebnerRow8_1000_f(groebnerMatrix,0xd);
  groebnerRow10_0000_f(groebnerMatrix,0xd);
  groebnerRow11_0000_f(groebnerMatrix,0xd);
  groebnerRow12_0000_f(groebnerMatrix,0xd);
  groebnerRow4_0000_f(groebnerMatrix,0xd);
  groebnerRow5_0000_f(groebnerMatrix,0xd);
  groebnerRow6_0000_f(groebnerMatrix,0xd);
  groebnerRow7_0000_f(groebnerMatrix,0xd);
  groebnerRow8_0000_f(groebnerMatrix,0xd);
  sPolynomial14(groebnerMatrix);
  groebnerRow5_0010_f(groebnerMatrix,0xe);
  groebnerRow6_0010_f(groebnerMatrix,0xe);
  groebnerRow4_0100_f(groebnerMatrix,0xe);
  groebnerRow5_0100_f(groebnerMatrix,0xe);
  groebnerRow6_0100_f(groebnerMatrix,0xe);
  groebnerRow7_0100_f(groebnerMatrix,0xe);
  groebnerRow8_0100_f(groebnerMatrix,0xe);
  groebnerRow9_0000_f(groebnerMatrix,0xe);
  groebnerRow4_1000_f(groebnerMatrix,0xe);
  groebnerRow5_1000_f(groebnerMatrix,0xe);
  groebnerRow6_1000_f(groebnerMatrix,0xe);
  groebnerRow7_1000_f(groebnerMatrix,0xe);
  groebnerRow8_1000_f(groebnerMatrix,0xe);
  groebnerRow10_0000_f(groebnerMatrix,0xe);
  groebnerRow11_0000_f(groebnerMatrix,0xe);
  groebnerRow12_0000_f(groebnerMatrix,0xe);
  groebnerRow13_0000_f(groebnerMatrix,0xe);
  groebnerRow4_0000_f(groebnerMatrix,0xe);
  groebnerRow5_0000_f(groebnerMatrix,0xe);
  groebnerRow6_0000_f(groebnerMatrix,0xe);
  groebnerRow7_0000_f(groebnerMatrix,0xe);
  groebnerRow8_0000_f(groebnerMatrix,0xe);
  sPolynomial15(groebnerMatrix);
  groebnerRow14_1000_f(groebnerMatrix,0xf);
  groebnerRow9_0000_f(groebnerMatrix,0xf);
  groebnerRow7_1000_f(groebnerMatrix,0xf);
  groebnerRow8_1000_f(groebnerMatrix,0xf);
  groebnerRow10_0000_f(groebnerMatrix,0xf);
  groebnerRow11_0000_f(groebnerMatrix,0xf);
  groebnerRow12_0000_f(groebnerMatrix,0xf);
  groebnerRow13_0000_f(groebnerMatrix,0xf);
  groebnerRow14_0000_f(groebnerMatrix,0xf);
  groebnerRow7_0000_f(groebnerMatrix,0xf);
  groebnerRow8_0000_f(groebnerMatrix,0xf);
  sPolynomial16(groebnerMatrix);
  groebnerRow13_1000_f(groebnerMatrix,0x10);
  groebnerRow14_1000_f(groebnerMatrix,0x10);
  groebnerRow8_0100_f(groebnerMatrix,0x10);
  groebnerRow15_0100_f(groebnerMatrix,0x10);
  groebnerRow5_1000_f(groebnerMatrix,0x10);
  groebnerRow6_1000_f(groebnerMatrix,0x10);
  groebnerRow7_1000_f(groebnerMatrix,0x10);
  groebnerRow8_1000_f(groebnerMatrix,0x10);
  groebnerRow15_1000_f(groebnerMatrix,0x10);
  groebnerRow11_0000_f(groebnerMatrix,0x10);
  groebnerRow12_0000_f(groebnerMatrix,0x10);
  groebnerRow13_0000_f(groebnerMatrix,0x10);
  groebnerRow14_0000_f(groebnerMatrix,0x10);
  groebnerRow5_0000_f(groebnerMatrix,0x10);
  groebnerRow6_0000_f(groebnerMatrix,0x10);
  groebnerRow7_0000_f(groebnerMatrix,0x10);
  groebnerRow8_0000_f(groebnerMatrix,0x10);
  groebnerRow15_0000_f(groebnerMatrix,0x10);
  sPolynomial17(groebnerMatrix);
  groebnerRow12_1000_f(groebnerMatrix,0x11);
  groebnerRow13_1000_f(groebnerMatrix,0x11);
  groebnerRow14_1000_f(groebnerMatrix,0x11);
  groebnerRow7_0100_f(groebnerMatrix,0x11);
  groebnerRow8_0100_f(groebnerMatrix,0x11);
  groebnerRow15_0100_f(groebnerMatrix,0x11);
  groebnerRow4_1000_f(groebnerMatrix,0x11);
  groebnerRow5_1000_f(groebnerMatrix,0x11);
  groebnerRow6_1000_f(groebnerMatrix,0x11);
  groebnerRow7_1000_f(groebnerMatrix,0x11);
  groebnerRow8_1000_f(groebnerMatrix,0x11);
  groebnerRow15_1000_f(groebnerMatrix,0x11);
  groebnerRow16_1000_f(groebnerMatrix,0x11);
  groebnerRow12_0000_f(groebnerMatrix,0x11);
  groebnerRow13_0000_f(groebnerMatrix,0x11);
  groebnerRow14_0000_f(groebnerMatrix,0x11);
  groebnerRow4_0000_f(groebnerMatrix,0x11);
  groebnerRow5_0000_f(groebnerMatrix,0x11);
  groebnerRow6_0000_f(groebnerMatrix,0x11);
  groebnerRow7_0000_f(groebnerMatrix,0x11);
  groebnerRow8_0000_f(groebnerMatrix,0x11);
  groebnerRow15_0000_f(groebnerMatrix,0x11);
  groebnerRow16_0000_f(groebnerMatrix,0x11);
  sPolynomial18(groebnerMatrix);
  groebnerRow14_0001_f(groebnerMatrix,0x12);
  groebnerRow14_0010_f(groebnerMatrix,0x12);
  groebnerRow13_1000_f(groebnerMatrix,0x12);
  groebnerRow14_1000_f(groebnerMatrix,0x12);
  groebnerRow7_0100_f(groebnerMatrix,0x12);
  groebnerRow8_0100_f(groebnerMatrix,0x12);
  groebnerRow15_0100_f(groebnerMatrix,0x12);
  groebnerRow4_1000_f(groebnerMatrix,0x12);
  groebnerRow5_1000_f(groebnerMatrix,0x12);
  groebnerRow6_1000_f(groebnerMatrix,0x12);
  groebnerRow7_1000_f(groebnerMatrix,0x12);
  groebnerRow8_1000_f(groebnerMatrix,0x12);
  groebnerRow15_1000_f(groebnerMatrix,0x12);
  groebnerRow16_1000_f(groebnerMatrix,0x12);
  groebnerRow17_1000_f(groebnerMatrix,0x12);
  groebnerRow13_0000_f(groebnerMatrix,0x12);
  groebnerRow14_0000_f(groebnerMatrix,0x12);
  groebnerRow4_0000_f(groebnerMatrix,0x12);
  groebnerRow5_0000_f(groebnerMatrix,0x12);
  groebnerRow6_0000_f(groebnerMatrix,0x12);
  groebnerRow7_0000_f(groebnerMatrix,0x12);
  groebnerRow8_0000_f(groebnerMatrix,0x12);
  groebnerRow15_0000_f(groebnerMatrix,0x12);
  groebnerRow16_0000_f(groebnerMatrix,0x12);
  groebnerRow17_0000_f(groebnerMatrix,0x12);
  sPolynomial19(groebnerMatrix);
  groebnerRow14_0000_f(groebnerMatrix,0x13);
  groebnerRow15_0000_f(groebnerMatrix,0x13);
  groebnerRow16_0000_f(groebnerMatrix,0x13);
  groebnerRow17_0000_f(groebnerMatrix,0x13);
  groebnerRow18_0000_f(groebnerMatrix,0x13);
  sPolynomial20(groebnerMatrix);
  groebnerRow18_1000_f(groebnerMatrix,0x14);
  groebnerRow19_1000_f(groebnerMatrix,0x14);
  groebnerRow15_0000_f(groebnerMatrix,0x14);
  groebnerRow16_0000_f(groebnerMatrix,0x14);
  groebnerRow17_0000_f(groebnerMatrix,0x14);
  groebnerRow18_0000_f(groebnerMatrix,0x14);
  groebnerRow19_0000_f(groebnerMatrix,0x14);
  sPolynomial21(groebnerMatrix);
  groebnerRow17_1000_f(groebnerMatrix,0x15);
  groebnerRow18_1000_f(groebnerMatrix,0x15);
  groebnerRow19_1000_f(groebnerMatrix,0x15);
  groebnerRow15_0000_f(groebnerMatrix,0x15);
  groebnerRow20_1000_f(groebnerMatrix,0x15);
  groebnerRow17_0000_f(groebnerMatrix,0x15);
  groebnerRow18_0000_f(groebnerMatrix,0x15);
  groebnerRow19_0000_f(groebnerMatrix,0x15);
  groebnerRow20_0000_f(groebnerMatrix,0x15);
  sPolynomial22(groebnerMatrix);
  groebnerRow19_0001_f(groebnerMatrix,0x16);
  groebnerRow19_0010_f(groebnerMatrix,0x16);
  groebnerRow18_1000_f(groebnerMatrix,0x16);
  groebnerRow19_1000_f(groebnerMatrix,0x16);
  groebnerRow20_0001_f(groebnerMatrix,0x16);
  groebnerRow20_0010_f(groebnerMatrix,0x16);
  groebnerRow21_0010_f(groebnerMatrix,0x16);
  groebnerRow20_0100_f(groebnerMatrix,0x16);
  groebnerRow21_0100_f(groebnerMatrix,0x16);
  groebnerRow15_0000_f(groebnerMatrix,0x16);
  groebnerRow20_1000_f(groebnerMatrix,0x16);
  groebnerRow21_1000_f(groebnerMatrix,0x16);
  groebnerRow18_0000_f(groebnerMatrix,0x16);
  groebnerRow19_0000_f(groebnerMatrix,0x16);
  groebnerRow20_0000_f(groebnerMatrix,0x16);
  groebnerRow21_0000_f(groebnerMatrix,0x16);
  sPolynomial23(groebnerMatrix);
  groebnerRow20_1100_f(groebnerMatrix,0x17);
  groebnerRow21_1100_f(groebnerMatrix,0x17);
  groebnerRow22_1100_f(groebnerMatrix,0x17);
  groebnerRow19_0001_f(groebnerMatrix,0x17);
  groebnerRow19_0010_f(groebnerMatrix,0x17);
  groebnerRow19_0100_f(groebnerMatrix,0x17);
  groebnerRow19_1000_f(groebnerMatrix,0x17);
  groebnerRow20_0001_f(groebnerMatrix,0x17);
  groebnerRow20_0010_f(groebnerMatrix,0x17);
  groebnerRow21_0010_f(groebnerMatrix,0x17);
  groebnerRow20_0100_f(groebnerMatrix,0x17);
  groebnerRow21_0100_f(groebnerMatrix,0x17);
  groebnerRow22_0100_f(groebnerMatrix,0x17);
  groebnerRow20_1000_f(groebnerMatrix,0x17);
  groebnerRow21_1000_f(groebnerMatrix,0x17);
  groebnerRow22_1000_f(groebnerMatrix,0x17);
  groebnerRow19_0000_f(groebnerMatrix,0x17);
  groebnerRow20_0000_f(groebnerMatrix,0x17);
  groebnerRow21_0000_f(groebnerMatrix,0x17);
  groebnerRow22_0000_f(groebnerMatrix,0x17);
  sPolynomial24(groebnerMatrix);
  groebnerRow20_0000_f(groebnerMatrix,0x18);
  groebnerRow21_0000_f(groebnerMatrix,0x18);
  groebnerRow22_0000_f(groebnerMatrix,0x18);
  groebnerRow23_0000_f(groebnerMatrix,0x18);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::compute(
    Eigen::Matrix<double,25,37> & groebnerMatrix )
{
  sPolynomial5(groebnerMatrix);

  sPolynomial6(groebnerMatrix);
  groebnerRow5_0000_f(groebnerMatrix,6);

  sPolynomial7(groebnerMatrix);
  groebnerRow5_0000_f(groebnerMatrix,7);
  groebnerRow6_0000_f(groebnerMatrix,7);

  sPolynomial8(groebnerMatrix);
  groebnerRow5_0000_f(groebnerMatrix,8);
  groebnerRow6_0000_f(groebnerMatrix,8);
  groebnerRow7_0000_f(groebnerMatrix,8);

  sPolynomial9(groebnerMatrix);
  groebnerRow7_0100_f(groebnerMatrix,9);
  groebnerRow8_0100_f(groebnerMatrix,9);
  groebnerRow5_1000_f(groebnerMatrix,9);
  groebnerRow6_1000_f(groebnerMatrix,9);
  groebnerRow7_1000_f(groebnerMatrix,9);
  groebnerRow8_1000_f(groebnerMatrix,9);
  groebnerRow5_0000_f(groebnerMatrix,9);
  groebnerRow6_0000_f(groebnerMatrix,9);
  groebnerRow7_0000_f(groebnerMatrix,9);
  groebnerRow8_0000_f(groebnerMatrix,9);

  sPolynomial10(groebnerMatrix);
  groebnerRow6_0100_f(groebnerMatrix,10);
  groebnerRow7_0100_f(groebnerMatrix,10);
  groebnerRow8_0100_f(groebnerMatrix,10);
  groebnerRow9_0000_f(groebnerMatrix,10);
  groebnerRow5_1000_f(groebnerMatrix,10);
  groebnerRow6_1000_f(groebnerMatrix,10);
  groebnerRow7_1000_f(groebnerMatrix,10);
  groebnerRow8_1000_f(groebnerMatrix,10);
  groebnerRow5_0000_f(groebnerMatrix,10);
  groebnerRow6_0000_f(groebnerMatrix,10);
  groebnerRow7_0000_f(groebnerMatrix,10);
  groebnerRow8_0000_f(groebnerMatrix,10);

  sPolynomial11(groebnerMatrix);
  groebnerRow6_0100_f(groebnerMatrix,11);
  groebnerRow7_0100_f(groebnerMatrix,11);
  groebnerRow8_0100_f(groebnerMatrix,11);
  groebnerRow9_0000_f(groebnerMatrix,11);
  groebnerRow4_1000_f(groebnerMatrix,11);
  groebnerRow5_1000_f(groebnerMatrix,11);
  groebnerRow6_1000_f(groebnerMatrix,11);
  groebnerRow7_1000_f(groebnerMatrix,11);
  groebnerRow8_1000_f(groebnerMatrix,11);
  groebnerRow10_0000_f(groebnerMatrix,11);
  groebnerRow4_0000_f(groebnerMatrix,11);
  groebnerRow5_0000_f(groebnerMatrix,11);
  groebnerRow6_0000_f(groebnerMatrix,11);
  groebnerRow7_0000_f(groebnerMatrix,11);
  groebnerRow8_0000_f(groebnerMatrix,11);

  sPolynomial12(groebnerMatrix);
  groebnerRow5_0100_f(groebnerMatrix,12);
  groebnerRow6_0100_f(groebnerMatrix,12);
  groebnerRow7_0100_f(groebnerMatrix,12);
  groebnerRow8_0100_f(groebnerMatrix,12);
  groebnerRow9_0000_f(groebnerMatrix,12);
  groebnerRow4_1000_f(groebnerMatrix,12);
  groebnerRow5_1000_f(groebnerMatrix,12);
  groebnerRow6_1000_f(groebnerMatrix,12);
  groebnerRow7_1000_f(groebnerMatrix,12);
  groebnerRow8_1000_f(groebnerMatrix,12);
  groebnerRow10_0000_f(groebnerMatrix,12);
  groebnerRow11_0000_f(groebnerMatrix,12);
  groebnerRow4_0000_f(groebnerMatrix,12);
  groebnerRow5_0000_f(groebnerMatrix,12);
  groebnerRow6_0000_f(groebnerMatrix,12);
  groebnerRow7_0000_f(groebnerMatrix,12);
  groebnerRow8_0000_f(groebnerMatrix,12);

  sPolynomial13(groebnerMatrix);
  groebnerRow6_0010_f(groebnerMatrix,13);
  groebnerRow4_0100_f(groebnerMatrix,13);
  groebnerRow5_0100_f(groebnerMatrix,13);
  groebnerRow6_0100_f(groebnerMatrix,13);
  groebnerRow7_0100_f(groebnerMatrix,13);
  groebnerRow8_0100_f(groebnerMatrix,13);
  groebnerRow9_0000_f(groebnerMatrix,13);
  groebnerRow4_1000_f(groebnerMatrix,13);
  groebnerRow5_1000_f(groebnerMatrix,13);
  groebnerRow6_1000_f(groebnerMatrix,13);
  groebnerRow7_1000_f(groebnerMatrix,13);
  groebnerRow8_1000_f(groebnerMatrix,13);
  groebnerRow10_0000_f(groebnerMatrix,13);
  groebnerRow11_0000_f(groebnerMatrix,13);
  groebnerRow12_0000_f(groebnerMatrix,13);
  groebnerRow4_0000_f(groebnerMatrix,13);
  groebnerRow5_0000_f(groebnerMatrix,13);
  groebnerRow6_0000_f(groebnerMatrix,13);
  groebnerRow7_0000_f(groebnerMatrix,13);
  groebnerRow8_0000_f(groebnerMatrix,13);

  sPolynomial14(groebnerMatrix);
  groebnerRow5_0010_f(groebnerMatrix,14);
  groebnerRow6_0010_f(groebnerMatrix,14);
  groebnerRow4_0100_f(groebnerMatrix,14);
  groebnerRow5_0100_f(groebnerMatrix,14);
  groebnerRow6_0100_f(groebnerMatrix,14);
  groebnerRow7_0100_f(groebnerMatrix,14);
  groebnerRow8_0100_f(groebnerMatrix,14);
  groebnerRow9_0000_f(groebnerMatrix,14);
  groebnerRow4_1000_f(groebnerMatrix,14);
  groebnerRow5_1000_f(groebnerMatrix,14);
  groebnerRow6_1000_f(groebnerMatrix,14);
  groebnerRow7_1000_f(groebnerMatrix,14);
  groebnerRow8_1000_f(groebnerMatrix,14);
  groebnerRow10_0000_f(groebnerMatrix,14);
  groebnerRow11_0000_f(groebnerMatrix,14);
  groebnerRow12_0000_f(groebnerMatrix,14);
  groebnerRow13_0000_f(groebnerMatrix,14);
  groebnerRow4_0000_f(groebnerMatrix,14);
  groebnerRow5_0000_f(groebnerMatrix,14);
  groebnerRow6_0000_f(groebnerMatrix,14);
  groebnerRow7_0000_f(groebnerMatrix,14);
  groebnerRow8_0000_f(groebnerMatrix,14);

  sPolynomial15(groebnerMatrix);
  groebnerRow14_1000_f(groebnerMatrix,15);
  groebnerRow9_0000_f(groebnerMatrix,15);
  groebnerRow7_1000_f(groebnerMatrix,15);
  groebnerRow8_1000_f(groebnerMatrix,15);
  groebnerRow10_0000_f(groebnerMatrix,15);
  groebnerRow11_0000_f(groebnerMatrix,15);
  groebnerRow12_0000_f(groebnerMatrix,15);
  groebnerRow13_0000_f(groebnerMatrix,15);
  groebnerRow14_0000_f(groebnerMatrix,15);
  groebnerRow7_0000_f(groebnerMatrix,15);
  groebnerRow8_0000_f(groebnerMatrix,15);

  sPolynomial16(groebnerMatrix);
  groebnerRow13_1000_f(groebnerMatrix,16);
  groebnerRow14_1000_f(groebnerMatrix,16);
  groebnerRow8_0100_f(groebnerMatrix,16);
  groebnerRow15_0100_f(groebnerMatrix,16);
  groebnerRow5_1000_f(groebnerMatrix,16);
  groebnerRow6_1000_f(groebnerMatrix,16);
  groebnerRow7_1000_f(groebnerMatrix,16);
  groebnerRow8_1000_f(groebnerMatrix,16);
  groebnerRow15_1000_f(groebnerMatrix,16);
  groebnerRow11_0000_f(groebnerMatrix,16);
  groebnerRow12_0000_f(groebnerMatrix,16);
  groebnerRow13_0000_f(groebnerMatrix,16);
  groebnerRow14_0000_f(groebnerMatrix,16);
  groebnerRow5_0000_f(groebnerMatrix,16);
  groebnerRow6_0000_f(groebnerMatrix,16);
  groebnerRow7_0000_f(groebnerMatrix,16);
  groebnerRow8_0000_f(groebnerMatrix,16);
  groebnerRow15_0000_f(groebnerMatrix,16);

  sPolynomial17(groebnerMatrix);
  groebnerRow12_1000_f(groebnerMatrix,17);
  groebnerRow13_1000_f(groebnerMatrix,17);
  groebnerRow14_1000_f(groebnerMatrix,17);
  groebnerRow7_0100_f(groebnerMatrix,17);
  groebnerRow8_0100_f(groebnerMatrix,17);
  groebnerRow15_0100_f(groebnerMatrix,17);
  groebnerRow4_1000_f(groebnerMatrix,17);
  groebnerRow5_1000_f(groebnerMatrix,17);
  groebnerRow6_1000_f(groebnerMatrix,17);
  groebnerRow7_1000_f(groebnerMatrix,17);
  groebnerRow8_1000_f(groebnerMatrix,17);
  groebnerRow15_1000_f(groebnerMatrix,17);
  groebnerRow16_1000_f(groebnerMatrix,17);
  groebnerRow12_0000_f(groebnerMatrix,17);
  groebnerRow13_0000_f(groebnerMatrix,17);
  groebnerRow14_0000_f(groebnerMatrix,17);
  groebnerRow4_0000_f(groebnerMatrix,17);
  groebnerRow5_0000_f(groebnerMatrix,17);
  groebnerRow6_0000_f(groebnerMatrix,17);
  groebnerRow7_0000_f(groebnerMatrix,17);
  groebnerRow8_0000_f(groebnerMatrix,17);
  groebnerRow15_0000_f(groebnerMatrix,17);
  groebnerRow16_0000_f(groebnerMatrix,17);

  sPolynomial18(groebnerMatrix);
  groebnerRow14_0001_f(groebnerMatrix,18);
  groebnerRow14_0010_f(groebnerMatrix,18);
  groebnerRow13_1000_f(groebnerMatrix,18);
  groebnerRow14_1000_f(groebnerMatrix,18);
  groebnerRow7_0100_f(groebnerMatrix,18);
  groebnerRow8_0100_f(groebnerMatrix,18);
  groebnerRow15_0100_f(groebnerMatrix,18);
  groebnerRow4_1000_f(groebnerMatrix,18);
  groebnerRow5_1000_f(groebnerMatrix,18);
  groebnerRow6_1000_f(groebnerMatrix,18);
  groebnerRow7_1000_f(groebnerMatrix,18);
  groebnerRow8_1000_f(groebnerMatrix,18);
  groebnerRow15_1000_f(groebnerMatrix,18);
  groebnerRow16_1000_f(groebnerMatrix,18);
  groebnerRow17_1000_f(groebnerMatrix,18);
  groebnerRow13_0000_f(groebnerMatrix,18);
  groebnerRow14_0000_f(groebnerMatrix,18);
  groebnerRow4_0000_f(groebnerMatrix,18);
  groebnerRow5_0000_f(groebnerMatrix,18);
  groebnerRow6_0000_f(groebnerMatrix,18);
  groebnerRow7_0000_f(groebnerMatrix,18);
  groebnerRow8_0000_f(groebnerMatrix,18);
  groebnerRow15_0000_f(groebnerMatrix,18);
  groebnerRow16_0000_f(groebnerMatrix,18);
  groebnerRow17_0000_f(groebnerMatrix,18);

  sPolynomial19(groebnerMatrix);
  groebnerRow14_0000_f(groebnerMatrix,19);
  groebnerRow15_0000_f(groebnerMatrix,19);
  groebnerRow16_0000_f(groebnerMatrix,19);
  groebnerRow17_0000_f(groebnerMatrix,19);
  groebnerRow18_0000_f(groebnerMatrix,19);

  sPolynomial20(groebnerMatrix);
  groebnerRow18_1000_f(groebnerMatrix,20);
  groebnerRow19_1000_f(groebnerMatrix,20);
  groebnerRow15_0000_f(groebnerMatrix,20);
  groebnerRow16_0000_f(groebnerMatrix,20);
  groebnerRow17_0000_f(groebnerMatrix,20);
  groebnerRow18_0000_f(groebnerMatrix,20);
  groebnerRow19_0000_f(groebnerMatrix,20);

  sPolynomial21(groebnerMatrix);
  groebnerRow17_1000_f(groebnerMatrix,21);
  groebnerRow18_1000_f(groebnerMatrix,21);
  groebnerRow19_1000_f(groebnerMatrix,21);
  groebnerRow15_0000_f(groebnerMatrix,21);
  groebnerRow20_1000_f(groebnerMatrix,21);
  groebnerRow17_0000_f(groebnerMatrix,21);
  groebnerRow18_0000_f(groebnerMatrix,21);
  groebnerRow19_0000_f(groebnerMatrix,21);
  groebnerRow20_0000_f(groebnerMatrix,21);

  sPolynomial22(groebnerMatrix);
  groebnerRow19_0001_f(groebnerMatrix,22);
  groebnerRow19_0010_f(groebnerMatrix,22);
  groebnerRow18_1000_f(groebnerMatrix,22);
  groebnerRow19_1000_f(groebnerMatrix,22);
  groebnerRow20_0001_f(groebnerMatrix,22);
  groebnerRow20_0010_f(groebnerMatrix,22);
  groebnerRow21_0010_f(groebnerMatrix,22);
  groebnerRow20_0100_f(groebnerMatrix,22);
  groebnerRow21_0100_f(groebnerMatrix,22);
  groebnerRow15_0000_f(groebnerMatrix,22);
  groebnerRow20_1000_f(groebnerMatrix,22);
  groebnerRow21_1000_f(groebnerMatrix,22);
  groebnerRow18_0000_f(groebnerMatrix,22);
  groebnerRow19_0000_f(groebnerMatrix,22);
  groebnerRow20_0000_f(groebnerMatrix,22);
  groebnerRow21_0000_f(groebnerMatrix,22);

  sPolynomial23(groebnerMatrix);
  groebnerRow20_1100_f(groebnerMatrix,23);
  groebnerRow21_1100_f(groebnerMatrix,23);
  groebnerRow22_1100_f(groebnerMatrix,23);
  groebnerRow19_0001_f(groebnerMatrix,23);
  groebnerRow19_0010_f(groebnerMatrix,23);
  groebnerRow19_0100_f(groebnerMatrix,23);
  groebnerRow19_1000_f(groebnerMatrix,23);
  groebnerRow20_0001_f(groebnerMatrix,23);
  groebnerRow20_0010_f(groebnerMatrix,23);
  groebnerRow21_0010_f(groebnerMatrix,23);
  groebnerRow20_0100_f(groebnerMatrix,23);
  groebnerRow21_0100_f(groebnerMatrix,23);
  groebnerRow22_0100_f(groebnerMatrix,23);
  groebnerRow20_1000_f(groebnerMatrix,23);
  groebnerRow21_1000_f(groebnerMatrix,23);
  groebnerRow22_1000_f(groebnerMatrix,23);
  groebnerRow19_0000_f(groebnerMatrix,23);
  groebnerRow20_0000_f(groebnerMatrix,23);
  groebnerRow21_0000_f(groebnerMatrix,23);
  groebnerRow22_0000_f(groebnerMatrix,23);

  sPolynomial24(groebnerMatrix);
  groebnerRow20_0000_f(groebnerMatrix,24);
  groebnerRow21_0000_f(groebnerMatrix,24);
  groebnerRow22_0000_f(groebnerMatrix,24);
  groebnerRow23_0000_f(groebnerMatrix,24);

}